

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTSoundBank_Prepare
                   (FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,int32_t timeOffset
                   ,FACTCue **ppCue)

{
  long lVar1;
  undefined8 uVar2;
  ushort in_SI;
  long *in_RDI;
  long *in_R8;
  FACTCue *latest;
  uint16_t i;
  long local_38;
  ushort local_2a;
  uint32_t local_4;
  
  if (in_RDI == (long *)0x0) {
    *in_R8 = 0;
    local_4 = 1;
  }
  else {
    lVar1 = (**(code **)(*in_RDI + 200))(0xb0);
    *in_R8 = lVar1;
    SDL_memset(*in_R8,0,0xb0);
    FAudio_PlatformLockMutex((FAudioMutex)0x1143c5);
    *(long **)*in_R8 = in_RDI;
    *(undefined8 *)(*in_R8 + 8) = 0;
    *(undefined1 *)(*in_R8 + 0x10) = 0;
    *(ushort *)(*in_R8 + 0x12) = in_SI;
    *(undefined1 *)(*in_R8 + 0x14) = 0;
    *(undefined8 *)(*in_R8 + 0x18) = 0;
    *(ulong *)(*in_R8 + 0x20) = in_RDI[9] + (ulong)in_SI * 0x14;
    if ((**(byte **)(*in_R8 + 0x20) & 4) == 0) {
      for (local_2a = 0; local_2a < *(ushort *)((long)in_RDI + 0x26); local_2a = local_2a + 1) {
        if (*(int *)(*(long *)(*in_R8 + 0x20) + 4) == *(int *)(in_RDI[0xd] + (ulong)local_2a * 4)) {
          *(ulong *)(*in_R8 + 0x28) = in_RDI[0xc] + (ulong)local_2a * 0x10;
          break;
        }
      }
      if (**(char **)(*in_R8 + 0x28) == '\x03') {
        *(undefined4 *)(*in_R8 + 0x38) =
             *(undefined4 *)
              (*(long *)(*in_RDI + 0x58) + (long)*(short *)(*(long *)(*in_R8 + 0x28) + 2) * 0x10 + 4
              );
      }
    }
    else {
      for (local_2a = 0; local_2a < *(ushort *)((long)in_RDI + 0x24); local_2a = local_2a + 1) {
        if (*(int *)(*(long *)(*in_R8 + 0x20) + 4) == *(int *)(in_RDI[0xb] + (ulong)local_2a * 4)) {
          *(ulong *)(*in_R8 + 0x28) = in_RDI[10] + (ulong)local_2a * 0x28;
          break;
        }
      }
    }
    uVar2 = (**(code **)(*in_RDI + 200))((ulong)*(ushort *)(*in_RDI + 0x22) << 2);
    *(undefined8 *)(*in_R8 + 0x30) = uVar2;
    for (local_2a = 0; local_2a < *(ushort *)(*in_RDI + 0x22); local_2a = local_2a + 1) {
      *(undefined4 *)(*(long *)(*in_R8 + 0x30) + (ulong)local_2a * 4) =
           *(undefined4 *)(*(long *)(*in_RDI + 0x58) + (ulong)local_2a * 0x10 + 4);
    }
    *(undefined4 *)(*in_R8 + 0x3c) = 4;
    if (in_RDI[1] == 0) {
      in_RDI[1] = *in_R8;
    }
    else {
      for (local_38 = in_RDI[1]; *(long *)(local_38 + 8) != 0; local_38 = *(long *)(local_38 + 8)) {
      }
      *(long *)(local_38 + 8) = *in_R8;
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x11468d);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTSoundBank_Prepare(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue
) {
	uint16_t i;
	FACTCue *latest;

	if (pSoundBank == NULL)
	{
		*ppCue = NULL;
		return 1;
	}

	*ppCue = (FACTCue*) pSoundBank->parentEngine->pMalloc(sizeof(FACTCue));
	FAudio_zero(*ppCue, sizeof(FACTCue));

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	/* Engine references */
	(*ppCue)->parentBank = pSoundBank;
	(*ppCue)->next = NULL;
	(*ppCue)->managed = 0;
	(*ppCue)->index = nCueIndex;
	(*ppCue)->notifyOnDestroy = 0;
	(*ppCue)->usercontext = NULL;

	/* Sound data */
	(*ppCue)->data = &pSoundBank->cues[nCueIndex];
	if ((*ppCue)->data->flags & 0x04)
	{
		for (i = 0; i < pSoundBank->soundCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->soundCodes[i])
			{
				(*ppCue)->sound = &pSoundBank->sounds[i];
				break;
			}
		}
	}
	else
	{
		for (i = 0; i < pSoundBank->variationCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->variationCodes[i])
			{
				(*ppCue)->variation = &pSoundBank->variations[i];
				break;
			}
		}
		if ((*ppCue)->variation->flags == 3)
		{
			(*ppCue)->interactive = pSoundBank->parentEngine->variables[
				(*ppCue)->variation->variable
			].initialValue;
		}
	}

	/* Instance data */
	(*ppCue)->variableValues = (float*) pSoundBank->parentEngine->pMalloc(
		sizeof(float) * pSoundBank->parentEngine->variableCount
	);
	for (i = 0; i < pSoundBank->parentEngine->variableCount; i += 1)
	{
		(*ppCue)->variableValues[i] =
			pSoundBank->parentEngine->variables[i].initialValue;
	}

	/* Playback */
	(*ppCue)->state = FACT_STATE_PREPARED;

	/* Add to the SoundBank Cue list */
	if (pSoundBank->cueList == NULL)
	{
		pSoundBank->cueList = *ppCue;
	}
	else
	{
		latest = pSoundBank->cueList;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = *ppCue;
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}